

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDErrorReporter.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSDErrorReporter::emitError
          (XSDErrorReporter *this,XMLException *except,Locator *aLocator)

{
  Codes CVar1;
  XMLErrorReporter *pXVar2;
  XMLCh *pXVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pXVar2 = this->fErrorReporter;
  if (pXVar2 != (XMLErrorReporter *)0x0) {
    CVar1 = except->fCode;
    pXVar3 = except->fMsg;
    iVar4 = (*aLocator->_vptr_Locator[3])(aLocator);
    iVar5 = (*aLocator->_vptr_Locator[2])(aLocator);
    iVar6 = (*aLocator->_vptr_Locator[4])(aLocator);
    iVar7 = (*aLocator->_vptr_Locator[5])(aLocator);
    (*pXVar2->_vptr_XMLErrorReporter[2])
              (pXVar2,(ulong)CVar1,&XMLUni::fgExceptDomain,1,pXVar3,CONCAT44(extraout_var,iVar4),
               CONCAT44(extraout_var_00,iVar5),CONCAT44(extraout_var_01,iVar6),
               CONCAT44(extraout_var_02,iVar7));
  }
  return;
}

Assistant:

void XSDErrorReporter::emitError(const XMLException&  except,
                                 const Locator* const aLocator)
{
    const XMLCh* const  errText = except.getMessage();
    const unsigned int  toEmit = except.getCode();
    //Before the code was modified to call this routine it used to use
    //the XMLErrs::DisplayErrorMessage error message, which is just {'0'}
    //and that error message has errType of Error.  So to be consistent
    //with previous behaviour set the errType to be Error instead of
    //getting the error type off of the exception.
    //XMLErrorReporter::ErrTypes errType = XMLErrs::errorType((XMLErrs::Codes) toEmit);
    XMLErrorReporter::ErrTypes errType = XMLErrorReporter::ErrType_Error;

    if (fErrorReporter)
        fErrorReporter->error(toEmit, XMLUni::fgExceptDomain, errType, errText, aLocator->getSystemId(),
                              aLocator->getPublicId(), aLocator->getLineNumber(),
                              aLocator->getColumnNumber());

    // Bail out if its fatal an we are to give up on the first fatal error
    //if (errType == XMLErrorReporter::ErrType_Fatal && fExitOnFirstFatal)
    //    throw (XMLErrs::Codes) toEmit;
}